

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::ParseAddtlInfo_SnapProxyInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  SnapProxyInfo *addtlInfo;
  TTD_PTR_ID TVar1;
  
  addtlInfo = (SnapProxyInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  TVar1 = FileReader::ReadAddr(reader,handlerId,true);
  addtlInfo->HandlerId = TVar1;
  TVar1 = FileReader::ReadAddr(reader,objectId,true);
  addtlInfo->TargetId = TVar1;
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapProxyInfo*,(TTD::NSSnapObjects::SnapObjectType)27>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapProxyInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapProxyInfo* proxyInfo = alloc.SlabAllocateStruct<SnapProxyInfo>();

            proxyInfo->HandlerId = reader->ReadAddr(NSTokens::Key::handlerId, true);
            proxyInfo->TargetId = reader->ReadAddr(NSTokens::Key::objectId, true);

            SnapObjectSetAddtlInfoAs<SnapProxyInfo*, SnapObjectType::SnapProxyObject>(snpObject, proxyInfo);
        }